

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O1

void VulkanUtilities::InsertCmdQueueLabel(VkQueue cmdQueue,char *pLabelName,float *color)

{
  VkDebugUtilsLabelEXT Label;
  undefined8 local_28;
  undefined8 uStack_20;
  char *local_18;
  undefined8 uStack_10;
  undefined8 local_8;
  
  if ((anonymous_namespace)::QueueInsertDebugUtilsLabelEXT != (code *)0x0) {
    local_28 = 0x3b9cbe02;
    uStack_20 = 0;
    uStack_10 = *(undefined8 *)color;
    local_8 = *(undefined8 *)(color + 2);
    local_18 = pLabelName;
    (*(anonymous_namespace)::QueueInsertDebugUtilsLabelEXT)(cmdQueue,&local_28);
  }
  return;
}

Assistant:

void InsertCmdQueueLabel(VkQueue cmdQueue, const char* pLabelName, const float* color)
{
    if (QueueInsertDebugUtilsLabelEXT == nullptr)
        return;

    VkDebugUtilsLabelEXT Label{};
    Label.sType      = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
    Label.pNext      = nullptr;
    Label.pLabelName = pLabelName;
    for (int i = 0; i < 4; ++i)
        Label.color[i] = color[i];
    QueueInsertDebugUtilsLabelEXT(cmdQueue, &Label);
}